

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

int pybind11_clear(PyObject *self)

{
  PyObject *op;
  undefined8 *puVar1;
  PyObject *_py_tmp;
  PyObject **dict;
  PyObject *self_local;
  
  puVar1 = (undefined8 *)_PyObject_GetDictPtr(self);
  op = (PyObject *)*puVar1;
  if (op != (PyObject *)0x0) {
    *puVar1 = 0;
    _Py_DECREF(op);
  }
  return 0;
}

Assistant:

inline int pybind11_clear(PyObject *self) {
#if PY_VERSION_HEX >= 0x030D0000
    PyObject_ClearManagedDict(self);
#else
    PyObject *&dict = *_PyObject_GetDictPtr(self);
    Py_CLEAR(dict);
#endif
    return 0;
}